

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PragmaDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>const&>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *args_2)

{
  Token directive;
  Token name;
  PragmaDirectiveSyntax *this_00;
  
  this_00 = (PragmaDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PragmaDirectiveSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (PragmaDirectiveSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  directive.kind = args->kind;
  directive._2_1_ = args->field_0x2;
  directive.numFlags.raw = (args->numFlags).raw;
  directive.rawLen = args->rawLen;
  directive.info = args->info;
  name.kind = args_1->kind;
  name._2_1_ = args_1->field_0x2;
  name.numFlags.raw = (args_1->numFlags).raw;
  name.rawLen = args_1->rawLen;
  name.info = args_1->info;
  slang::syntax::PragmaDirectiveSyntax::PragmaDirectiveSyntax(this_00,directive,name,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }